

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::SubroutineFunction
          (SubroutineFunction *this,SubroutineFunction *param_1)

{
  NumSys NVar1;
  SubroutineFunction *param_1_local;
  SubroutineFunction *this_local;
  
  (this->index).super_LayoutSpecifierBase.occurence.occurence =
       (param_1->index).super_LayoutSpecifierBase.occurence.occurence;
  NVar1 = (param_1->index).super_LayoutSpecifierBase.numSys;
  (this->index).super_LayoutSpecifierBase.val = (param_1->index).super_LayoutSpecifierBase.val;
  (this->index).super_LayoutSpecifierBase.numSys = NVar1;
  UniformValue::UniformValue(&this->embeddedRetVal,&param_1->embeddedRetVal);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}